

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

uint Vec_IntUniqueHashKey(uchar *pStr,int nChars)

{
  uint local_1c;
  uint local_18;
  int c;
  uint Key;
  int nChars_local;
  uchar *pStr_local;
  
  local_18 = 0;
  for (local_1c = 0; (int)local_1c < nChars; local_1c = local_1c + 1) {
    local_18 = Vec_IntUniqueHashKey::s_BigPrimes2[(int)((local_1c & 7) << 1)] *
               Vec_IntUniqueHashKey::s_BigPrimes[pStr[(int)local_1c] & 0xf] +
               Vec_IntUniqueHashKey::s_BigPrimes2[(int)(local_1c * 2 + 1 & 0xf)] *
               Vec_IntUniqueHashKey::s_BigPrimes[pStr[(int)local_1c] >> 4] + local_18;
  }
  return local_18;
}

Assistant:

static inline unsigned Vec_IntUniqueHashKey( unsigned char * pStr, int nChars )
{
    static unsigned s_BigPrimes[16] = 
    {
        0x984b6ad9,0x18a6eed3,0x950353e2,0x6222f6eb,0xdfbedd47,0xef0f9023,0xac932a26,0x590eaf55,
        0x97d0a034,0xdc36cd2e,0x22736b37,0xdc9066b0,0x2eb2f98b,0x5d9c7baf,0x85747c9e,0x8aca1055
    };
    static unsigned s_BigPrimes2[16] = 
    {
        0x8d8a5ebe,0x1e6a15dc,0x197d49db,0x5bab9c89,0x4b55dea7,0x55dede49,0x9a6a8080,0xe5e51035,
        0xe148d658,0x8a17eb3b,0xe22e4b38,0xe5be2a9a,0xbe938cbb,0x3b981069,0x7f9c0c8e,0xf756df10
    };
    unsigned Key = 0; int c;
    for ( c = 0; c < nChars; c++ )
        Key += s_BigPrimes2[(2*c)&15]   * s_BigPrimes[(unsigned)pStr[c] & 15] +
               s_BigPrimes2[(2*c+1)&15] * s_BigPrimes[(unsigned)pStr[c] >> 4];
    return Key;
}